

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O1

void __thiscall
nowtech::memory::
PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)'\x02',_false,_100UL>::Occupier>::
PoolAllocatorBase(PoolAllocatorBase<nowtech::log::AppInterfaceStd<(unsigned_char)__x02_,_false,_100UL>::Occupier>
                  *this,size_t aPoolSize,size_t aNodeSize,Occupier *aOccupier)

{
  long lVar1;
  void **ppvVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  this->mOriginal = this;
  this->mIsOriginal = true;
  this->mOccupier = aOccupier;
  this->mPoolSize = aPoolSize;
  this->mNodeSize = aNodeSize;
  uVar5 = aNodeSize + 7 >> 3;
  this->mBlockSizeInPointerSize = uVar5;
  ppvVar2 = (void **)operator_new__((aPoolSize + 1) * (aNodeSize + 7 & 0xfffffffffffffff8));
  this->mMemory = ppvVar2;
  this->mFirst = ppvVar2;
  lVar4 = uVar5 * aPoolSize;
  this->mProhibited = ppvVar2 + lVar4;
  if (aPoolSize != 0) {
    lVar3 = 0;
    do {
      lVar1 = lVar3 + uVar5 * 8;
      *(long *)((long)this->mFirst + lVar3) = (long)this->mFirst + lVar1;
      aPoolSize = aPoolSize - 1;
      lVar3 = lVar1;
    } while (aPoolSize != 0);
  }
  this->mFirst[lVar4] = (void *)0x0;
  return;
}

Assistant:

PoolAllocatorBase(size_t const aPoolSize, size_t aNodeSize, tInterface& aOccupier) noexcept
    : mOriginal(this)
    , mIsOriginal(true)
    , mOccupier(aOccupier)
    , mPoolSize(aPoolSize)
    , mNodeSize(aNodeSize)
    , mBlockSizeInPointerSize((mNodeSize + sizeof(void*) - 1u) / sizeof(void*))
    , mMemory(mOccupier.occupy(mBlockSizeInPointerSize * sizeof(void*) * (mPoolSize + 1u)))
    , mFirst(reinterpret_cast<void**>(mMemory))
    , mProhibited(mFirst + mPoolSize * mBlockSizeInPointerSize) {
    for(size_t i = 0u; i < mPoolSize; ++i) {
      mFirst[i * mBlockSizeInPointerSize] = static_cast<void*>(mFirst + (i + 1u) * mBlockSizeInPointerSize);
    }
    mFirst[mPoolSize * mBlockSizeInPointerSize] = nullptr;
  }